

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_char_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_char>
          (ExpressionLhs<unsigned_char_const&> *this,uchar *rhs)

{
  ResultBuilder *pRVar1;
  OfType OVar2;
  char in_stack_ffffffffffffff7f;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  OVar2 = ExpressionFailed;
  if (**(uchar **)(this + 8) == *rhs) {
    OVar2 = Ok;
  }
  pRVar1 = *(ResultBuilder **)this;
  (pRVar1->m_data).resultType = OVar2;
  Catch::toString_abi_cxx11_(in_stack_ffffffffffffff7f);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(in_stack_ffffffffffffff7f);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }